

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functions.c
# Opt level: O2

uint Jupiter_strtoui_nospace_s(char *str,size_t length,int base)

{
  char cVar1;
  uint uVar2;
  size_t sVar3;
  
  if (length == 0) {
    return 0;
  }
  if (*str == '+') {
    length = length - 1;
    if (length == 0) {
      return 0;
    }
    str = str + 1;
  }
  else if (*str == '-') {
    uVar2 = Jupiter_strtoi_nospace(str,base);
    return uVar2;
  }
  if (base == 0x10) {
    base = 0x10;
    if (*str != '0') goto LAB_00138eed;
    if (length == 1) {
      return 0;
    }
    if ((byte)(str[1] | 0x20U) == 0x78) {
      length = length - 2;
      if (length == 0) {
        return 0;
      }
      str = str + 2;
      goto LAB_00138eed;
    }
LAB_00138eea:
    length = length - 1;
    str = str + 1;
    goto LAB_00138eed;
  }
  if (base != 0) goto LAB_00138eed;
  if (*str != '0') {
    base = 10;
    goto LAB_00138eed;
  }
  if (length == 1) {
    return 0;
  }
  cVar1 = str[1];
  if (cVar1 == 'B') {
LAB_00138ed1:
    length = length - 2;
    if (length == 0) {
      return 0;
    }
    str = str + 2;
    base = 2;
  }
  else {
    if (cVar1 != 'x') {
      if (cVar1 == 'b') goto LAB_00138ed1;
      if (cVar1 != 'X') {
        base = 8;
        goto LAB_00138eea;
      }
    }
    length = length - 2;
    if (length == 0) {
      return 0;
    }
    str = str + 2;
    base = 0x10;
  }
LAB_00138eed:
  sVar3 = 0;
  uVar2 = 0;
  do {
    if (base <= (int)(uint)"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                           [(byte)str[sVar3]]) {
      return uVar2;
    }
    uVar2 = uVar2 * base +
            (uint)"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                  [(byte)str[sVar3]];
    sVar3 = sVar3 + 1;
  } while (length != sVar3);
  return uVar2;
}

Assistant:

unsigned int Jupiter_strtoui_nospace_s(const char *str, size_t length, int base)
{
	unsigned int total = 0;
	int tval;

	if (length == 0)
		return total;

	if (*str == '-')
		return Jupiter_strtoi_nospace(str, base);

	if (*str == '+')
	{
		if (--length == 0)
			return total;
		++str;
	}

	if (base == 0) // Guess a base.
	{
		if (*str == '0')
		{
			if (--length == 0)
				return total;

			++str;
			switch (*str)
			{
			case 'X':
			case 'x':
				if (--length == 0)
					return total;

				++str;
				base = 16;
				break;

			case 'B':
			case 'b':
				if (--length == 0)
					return total;

				++str;
				base = 2;
				break;

			default:
				base = 8;
				break;
			}
		}
		else base = 10;
	}
	else if (base == 16) // check for optional preceeding hexadecimal prefix.
	{
		if (*str == '0')
		{
			if (--length == 0)
				return total;
			++str;
			if (*str == 'x' || *str == 'X')
			{
				if (--length == 0)
					return total;
				++str;
			}
		}
	}

	while ((tval = Jupiter_getBase(*str, base)) != -1)
	{
		total = base * total + tval;
		if (--length == 0)
			return total;
		++str;
	}

	return total;
}